

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf128.c
# Opt level: O0

void cf_gf128_double(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint32_t inword;
  uint32_t borrow;
  uint8_t table [2];
  uint32_t *out_local;
  uint32_t *in_local;
  
  inword._2_2_ = 0x8700;
  uVar1 = in[3];
  out[3] = uVar1 << 1;
  uVar2 = in[2];
  out[2] = uVar2 << 1 | uVar1 >> 0x1f;
  uVar1 = in[1];
  out[1] = uVar1 << 1 | uVar2 >> 0x1f;
  uVar2 = *in;
  *out = uVar2 << 1 | uVar1 >> 0x1f;
  _borrow = out;
  bVar3 = select_u8(uVar2 >> 0x1f,(uint8_t *)((long)&inword + 2),2);
  _borrow[3] = (uint)bVar3 ^ _borrow[3];
  return;
}

Assistant:

void cf_gf128_double(const cf_gf128 in, cf_gf128 out)
{
  uint8_t table[2] = { 0x00, 0x87 };
  uint32_t borrow = 0;
  uint32_t inword;

  inword = in[3];   out[3] = (inword << 1) | borrow;  borrow = inword >> 31;
  inword = in[2];   out[2] = (inword << 1) | borrow;  borrow = inword >> 31;
  inword = in[1];   out[1] = (inword << 1) | borrow;  borrow = inword >> 31;
  inword = in[0];   out[0] = (inword << 1) | borrow;  borrow = inword >> 31;

#if CF_CACHE_SIDE_CHANNEL_PROTECTION
  out[3] ^= select_u8(borrow, table, 2);
#else
  out[3] ^= table[borrow];
#endif
}